

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void __thiscall tcu::CommandLine::CommandLine(CommandLine *this,int argc,char **argv)

{
  bool bVar1;
  Exception *this_00;
  allocator<char> local_51;
  string local_50;
  char **local_20;
  char **argv_local;
  CommandLine *pCStack_10;
  int argc_local;
  CommandLine *this_local;
  
  this->_vptr_CommandLine = (_func_int **)&PTR_registerExtendedOptions_0067b360;
  local_20 = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  de::cmdline::detail::CommandLine::CommandLine(&this->m_cmdLine);
  this->m_logFlags = 0;
  bVar1 = parse(this,argv_local._4_4_,local_20);
  if (!bVar1) {
    this_00 = (Exception *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Failed to parse command line",&local_51);
    Exception::Exception(this_00,&local_50);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

CommandLine::CommandLine (int argc, const char* const* argv)
	: m_logFlags	(0)
{
	if (!parse(argc, argv))
		throw Exception("Failed to parse command line");
}